

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,unsigned_int,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,uint significand,
          int significand_size,int integral_size,wchar_t decimal_point,
          digit_grouping<wchar_t> *grouping)

{
  uint uVar1;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar2;
  uint uVar3;
  int iVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  format_decimal_result<wchar_t_*> fVar8;
  basic_string_view<wchar_t> digits;
  wchar_t wStack_858;
  wchar_t awStack_854 [11];
  undefined8 local_828;
  undefined1 *local_820;
  long lStack_818;
  long local_810;
  undefined1 local_808 [2016];
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    if (decimal_point == L'\0') {
      fVar8 = format_decimal<wchar_t,unsigned_int>
                        ((wchar_t *)&local_828,significand,significand_size);
      pwVar5 = fVar8.end;
    }
    else {
      pwVar5 = (wchar_t *)((long)&local_828 + (long)significand_size * 4 + 4);
      uVar3 = significand_size - integral_size;
      pwVar6 = pwVar5;
      if (1 < (int)uVar3) {
        iVar4 = (uVar3 >> 1) + 1;
        pwVar7 = pwVar5;
        uVar1 = significand;
        do {
          pwVar6 = pwVar7 + -2;
          significand = uVar1 / 100;
          pwVar7[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                            [(ulong)(uVar1 % 100) * 2];
          pwVar7[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                            [(ulong)(uVar1 % 100) * 2 + 1];
          iVar4 = iVar4 + -1;
          pwVar7 = pwVar6;
          uVar1 = uVar1 / 100;
        } while (1 < iVar4);
      }
      uVar1 = significand;
      if ((uVar3 & 1) != 0) {
        uVar1 = significand / 10;
        pwVar6[-1] = significand % 10 + L'0';
        pwVar6 = pwVar6 + -1;
      }
      pwVar6[-1] = decimal_point;
      format_decimal<wchar_t,unsigned_int>(pwVar6 + (-1 - (long)integral_size),uVar1,integral_size);
    }
    bVar2 = copy_str_noinline<wchar_t,wchar_t*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                      ((wchar_t *)&local_828,pwVar5,out);
  }
  else {
    lStack_818 = 0;
    local_828 = &PTR_grow_001b29b0;
    local_810 = 500;
    local_820 = local_808;
    if (decimal_point == L'\0') {
      fVar8 = format_decimal<wchar_t,unsigned_int>(&wStack_858,significand,significand_size);
      pwVar5 = fVar8.end;
    }
    else {
      pwVar5 = awStack_854 + significand_size;
      uVar3 = significand_size - integral_size;
      pwVar6 = pwVar5;
      if (1 < (int)uVar3) {
        iVar4 = (uVar3 >> 1) + 1;
        pwVar7 = pwVar5;
        uVar1 = significand;
        do {
          pwVar6 = pwVar7 + -2;
          significand = uVar1 / 100;
          pwVar7[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                            [(ulong)(uVar1 % 100) * 2];
          pwVar7[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                            [(ulong)(uVar1 % 100) * 2 + 1];
          iVar4 = iVar4 + -1;
          pwVar7 = pwVar6;
          uVar1 = uVar1 / 100;
        } while (1 < iVar4);
      }
      uVar1 = significand;
      if ((uVar3 & 1) != 0) {
        uVar1 = significand / 10;
        pwVar6[-1] = significand % 10 + L'0';
        pwVar6 = pwVar6 + -1;
      }
      pwVar6[-1] = decimal_point;
      format_decimal<wchar_t,unsigned_int>(pwVar6 + (-1 - (long)integral_size),uVar1,integral_size);
    }
    copy_str_noinline<wchar_t,wchar_t*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
              (&wStack_858,pwVar5,(buffer<wchar_t> *)&local_828);
    if (integral_size < 0) {
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    }
    digits.size_._0_4_ = integral_size;
    digits.data_ = (wchar_t *)local_820;
    digits.size_._4_4_ = 0;
    digit_grouping<wchar_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>(grouping,out,digits);
    bVar2 = copy_str_noinline<wchar_t,wchar_t*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                      ((wchar_t *)(local_820 + (ulong)(uint)integral_size * 4),
                       (wchar_t *)(local_820 + lStack_818 * 4),out);
    if (local_820 != local_808) {
      operator_delete(local_820,local_810 << 2);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}